

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> __thiscall
wabt::MakeUnique<wabt::TryExpr,wabt::Location&>(wabt *this,Location *args)

{
  TryExpr *this_00;
  
  this_00 = (TryExpr *)operator_new(0x130);
  TryExpr::TryExpr(this_00,args);
  *(TryExpr **)this = this_00;
  return (__uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true>)
         (__uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}